

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O0

void parse_preproc_if_line(Source_File *src,Translation_Data *translation_data)

{
  Normal_Scope *scope;
  Queue *pQVar1;
  AST *expression;
  longlong lVar2;
  token *ptVar3;
  int result;
  token *hold_token;
  Scope *null_scope;
  AST *condition;
  Queue *swap;
  Queue *tokens;
  Translation_Data *translation_data_local;
  Source_File *src_local;
  
  scope = (Normal_Scope *)get_normal_scope((Scope *)0x0,FILE_SCOPE);
  pQVar1 = lex_line(src,translation_data,'\x01');
  translation_data->tokens = pQVar1;
  expression = parse_expression(translation_data,(Scope *)scope);
  lVar2 = evaluate_const_expression_integer(expression,translation_data);
  delete_normal_scope(scope);
  delete_ast(expression);
  if ((int)lVar2 == 0) {
    ptVar3 = preproc_find_else(src,translation_data,'\0');
    if ((ptVar3 == (token *)0x0) || (ptVar3->type != PKW_ELIF)) {
      if (ptVar3 != (token *)0x0) {
        preproc_lex_first_part(src,translation_data);
      }
    }
    else {
      parse_preproc_if_line(src,translation_data);
    }
  }
  else {
    preproc_lex_first_part(src,translation_data);
  }
  return;
}

Assistant:

void parse_preproc_if_line(struct Source_File *src,struct Translation_Data *translation_data)
{

	struct Queue *tokens;
	struct Queue *swap;
	struct AST *condition;
	struct Scope *null_scope;
	struct token *hold_token;
	int result;

	null_scope=get_normal_scope(NULL,FILE_SCOPE);

	tokens=lex_line(src,translation_data,1);

	swap=translation_data->tokens;
	translation_data->tokens=tokens;

	condition=parse_expression(translation_data,null_scope);
	result=evaluate_const_expression_integer(condition,translation_data);
	delete_normal_scope((struct Normal_Scope*)null_scope);
	delete_ast(condition);

	if(result)
	{
		preproc_lex_first_part(src,translation_data);	
	}else
	{
		hold_token=preproc_find_else(src,translation_data,0);
		if(hold_token!=NULL && hold_token->type==PKW_ELIF)
		{
			parse_preproc_if_line(src,translation_data);
		}
		else if(hold_token!=NULL)
		{
			preproc_lex_first_part(src,translation_data);
		}
	}	
		
	
}